

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_private.hpp
# Opt level: O0

void __thiscall Infector::Container::wire<Booom,Kaaa>(Container *this)

{
  bool bVar1;
  mapped_type *this_00;
  pointer ppVar2;
  mapped_type *this_01;
  type_index local_78;
  anon_class_8_1_8991fb9c local_70;
  type_index local_68;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  local_60;
  type_index local_58;
  anon_class_8_1_8991fb9c local_50;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  local_48;
  type_index local_40;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  local_38;
  iterator it3;
  type_index local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  local_20;
  iterator it2;
  bool tests;
  Container *this_local;
  
  it2.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  ._M_cur._7_1_ = reduced_type_tests<Booom>();
  std::type_index::type_index(&local_28,(type_info *)&Booom::typeinfo);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
       ::find(&this->callbacks,&local_28);
  it3.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
             )std::
              unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
              ::end(&this->callbacks);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                      *)&it3);
  if (bVar1) {
    launch_exception<Infector::ExWireAgain>(this);
  }
  std::type_index::type_index(&local_40,(type_info *)&Booom::typeinfo);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
       ::find(&this->recursionMap,&local_40);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
       ::end(&this->recursionMap);
  bVar1 = std::__detail::operator==(&local_38,&local_48);
  if (bVar1) {
    local_50.this = this;
    std::type_index::type_index(&local_58,(type_info *)&Booom::typeinfo);
    this_00 = std::
              unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
              ::operator[](&this->recursionMap,&local_58);
    std::function<bool(Infector::RecursionLimit*,int*)>::operator=
              ((function<bool(Infector::RecursionLimit*,int*)> *)this_00,&local_50);
    std::type_index::type_index(&local_68,(type_info *)&Booom::typeinfo);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
         ::find(&this->recursionMap,&local_68);
    local_38._M_cur = local_60._M_cur;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false,_false>
                           *)&local_38);
    std::__cxx11::
    list<std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::allocator<std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>
    ::push_back(&this->recursionWaitList,&ppVar2->second);
  }
  processRecursionWeb<Infector::DummyClass>(this);
  local_70.this = this;
  std::type_index::type_index(&local_78,(type_info *)&Booom::typeinfo);
  this_01 = std::
            unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
            ::operator[](&this->callbacks,&local_78);
  std::function<void*(Infector::Container::EmplaceContext*)>::operator=
            ((function<void*(Infector::Container::EmplaceContext*)> *)this_01,&local_70);
  return;
}

Assistant:

void Container::wire(){
        bool tests = reduced_type_tests<T>();
        (void) tests; //fix unused variable warning

        auto it2 = callbacks.find(std::type_index(typeid(T)));
        if( it2!=callbacks.end())
            launch_exception<ExWireAgain>();

        auto it3 = recursionMap.find(std::type_index(typeid(T)));
        if( it3==recursionMap.end()){
            recursionMap[std::type_index(typeid(T))] =
                    [this] (RecursionLimit *limit, int *size){
                        (*size)+= sizeof(T);
                        bool result =
                            tryToGetSize<Dependencies...
                                        ,DummyClass>(limit,size);

                        return result;
                    }; //now the function exist.
            it3 = recursionMap.find(std::type_index(typeid(T)));
            recursionWaitList.push_back(it3->second);
        }

        processRecursionWeb(); //do lots of checks during "wire"
                               //find errors early!

        // THROW... ok exception safe! Indipendently of parameters order
        callbacks[std::type_index(typeid(T))] =
                    [this] (EmplaceContext * context) {
                        (void)context; //fix unused parameter warning.
                        return reinterpret_cast<void*>(
                            new T(UniqueOrShared<Dependencies>(this,context)...)
                        );
                    };
    }